

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O2

bool draco::DecodeTaggedSymbols<draco::RAnsSymbolDecoder>
               (uint32_t num_values,int num_components,DecoderBuffer *src_buffer,
               uint32_t *out_values)

{
  bool bVar1;
  uint32_t nbits;
  uint uVar2;
  long lVar3;
  uint32_t val;
  RAnsSymbolDecoder<5> tag_decoder;
  int local_bc;
  uint32_t local_ac;
  ulong local_a8;
  ulong local_a0;
  RAnsSymbolDecoder<5> local_98;
  
  local_98.ans_.ans_.buf = (uint8_t *)0x0;
  local_98.ans_.ans_.buf_offset = 0;
  local_98.ans_.ans_.state = 0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_98._20_8_ = 0;
  bVar1 = RAnsSymbolDecoder<5>::Create(&local_98,src_buffer);
  if (bVar1) {
    bVar1 = RAnsSymbolDecoder<5>::StartDecoding(&local_98,src_buffer);
    if ((bVar1) && ((num_values == 0 || (local_98.num_symbols_ != 0)))) {
      local_a0 = 0;
      DecoderBuffer::StartBitDecoding(src_buffer,false,(uint64_t *)0x0);
      local_a8 = 0;
      if (0 < num_components) {
        local_a8 = (ulong)(uint)num_components;
      }
      local_bc = (int)local_a8;
      for (uVar2 = 0; uVar2 < num_values; uVar2 = uVar2 + num_components) {
        nbits = RAnsDecoder<12>::rans_read(&local_98.ans_);
        local_a0 = (ulong)(uint)((int)local_a8 + (int)local_a0);
        for (lVar3 = (long)(int)local_a0; local_bc != lVar3; lVar3 = lVar3 + 1) {
          bVar1 = DecoderBuffer::DecodeLeastSignificantBits32(src_buffer,nbits,&local_ac);
          if (!bVar1) goto LAB_00147e46;
          out_values[lVar3] = local_ac;
        }
        local_bc = local_bc + (int)local_a8;
      }
      bVar1 = true;
      DecoderBuffer::EndBitDecoding(src_buffer);
      goto LAB_00147e48;
    }
  }
LAB_00147e46:
  bVar1 = false;
LAB_00147e48:
  RAnsSymbolDecoder<5>::~RAnsSymbolDecoder(&local_98);
  return bVar1;
}

Assistant:

bool DecodeTaggedSymbols(uint32_t num_values, int num_components,
                         DecoderBuffer *src_buffer, uint32_t *out_values) {
  // Decode the encoded data.
  SymbolDecoderT<5> tag_decoder;
  if (!tag_decoder.Create(src_buffer)) {
    return false;
  }

  if (!tag_decoder.StartDecoding(src_buffer)) {
    return false;
  }

  if (num_values > 0 && tag_decoder.num_symbols() == 0) {
    return false;  // Wrong number of symbols.
  }

  // src_buffer now points behind the encoded tag data (to the place where the
  // values are encoded).
  src_buffer->StartBitDecoding(false, nullptr);
  int value_id = 0;
  for (uint32_t i = 0; i < num_values; i += num_components) {
    // Decode the tag.
    const uint32_t bit_length = tag_decoder.DecodeSymbol();
    // Decode the actual value.
    for (int j = 0; j < num_components; ++j) {
      uint32_t val;
      if (!src_buffer->DecodeLeastSignificantBits32(bit_length, &val)) {
        return false;
      }
      out_values[value_id++] = val;
    }
  }
  tag_decoder.EndDecoding();
  src_buffer->EndBitDecoding();
  return true;
}